

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Device_Plugin.cxx
# Opt level: O3

int __thiscall
Fl_Gl_Device_Plugin::print(Fl_Gl_Device_Plugin *this,Fl_Widget *w,int x,int y,int height)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_RGB_Image *pFVar4;
  Fl_Gl_Window *glw;
  
  iVar3 = (*w->_vptr_Fl_Widget[9])(w);
  glw = (Fl_Gl_Window *)CONCAT44(extraout_var,iVar3);
  if (glw == (Fl_Gl_Window *)0x0) {
    iVar3 = 0;
  }
  else {
    pFVar4 = capture_gl_rectangle
                       (glw,0,0,(glw->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                        (glw->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_);
    uVar1 = (pFVar4->super_Fl_Image).w_;
    iVar3 = (pFVar4->super_Fl_Image).ld_;
    if (iVar3 == 0) {
      iVar3 = (pFVar4->super_Fl_Image).d_ * uVar1;
    }
    uVar2 = (pFVar4->super_Fl_Image).h_;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
              (fl_graphics_driver,pFVar4->array + (int)((uVar2 - 1) * iVar3),(ulong)(uint)x,
               (ulong)(uint)y,(ulong)uVar1,(ulong)uVar2,3,(ulong)(uint)-iVar3);
    (*(pFVar4->super_Fl_Image)._vptr_Fl_Image[1])(pFVar4);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

virtual int print(Fl_Widget *w, int x, int y, int height /*useless*/) {
    Fl_Gl_Window *glw = w->as_gl_window();
    if (!glw) return 0;
    Fl_RGB_Image *img = capture_gl_rectangle(glw, 0, 0, glw->w(), glw->h());
#ifdef __APPLE__
    if (Fl_Surface_Device::surface()->class_name() == Fl_Printer::class_id) {
      // convert the image to CGImage, and draw it at full res (useful on retina display)
      CGColorSpaceRef cSpace = CGColorSpaceCreateDeviceRGB();
      CGDataProviderRef provider = CGDataProviderCreateWithData(img, img->array, img->ld() * img->h(), imgProviderReleaseData);
      CGImageRef cgimg = CGImageCreate(img->w(), img->h(), 8, 24, img->ld(), cSpace,
                                     (CGBitmapInfo)(kCGImageAlphaNone),
                                     provider, NULL, false, kCGRenderingIntentDefault);
      CGColorSpaceRelease(cSpace);
      CGDataProviderRelease(provider);
      CGContextDrawImage(fl_gc, CGRectMake(0, 0, glw->w(), glw->h()), cgimg);
      CFRelease(cgimg);
      return 1;
    } else if (img->w() > glw->w()) {
      Fl_RGB_Image *img2 = (Fl_RGB_Image*)img->copy(glw->w(), glw->h());
      delete img;
      img = img2;
    }
#endif
    int ld = img->ld() ? img->ld() : img->w() * img->d();
    fl_draw_image(img->array + (img->h() - 1) * ld, x, y , img->w(), img->h(), 3, - ld);
    delete img;
    return 1;
  }